

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::populateFixedArgs
          (CommandLine<Catch::ConfigData> *this,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  bool bVar1;
  value_type *pvVar2;
  const_iterator this_00;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *in_RDX;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *in_RDI;
  const_iterator it;
  Token *token;
  size_t i;
  int position;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *unusedTokens;
  ConfigData *in_stack_ffffffffffffff78;
  value_type *__x;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *this_01;
  _Self local_58 [3];
  _Self local_40;
  const_reference local_38;
  value_type *local_30;
  int local_28;
  undefined1 local_21;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *local_18;
  
  local_21 = 0;
  this_01 = in_RDI;
  local_18 = in_RDX;
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::vector
            ((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
             0x19e96f);
  local_28 = 1;
  local_30 = (value_type *)0x0;
  while (__x = local_30,
        pvVar2 = (value_type *)
                 std::
                 vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
                 size(local_18), __x < pvVar2) {
    local_38 = std::
               vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
               operator[](local_18,(size_type)local_30);
    this_00 = std::
              map<int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::less<int>,_std::allocator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
              ::find((map<int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::less<int>,_std::allocator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                      *)in_stack_ffffffffffffff78,(key_type *)0x19e9cc);
    local_40._M_node = this_00._M_node;
    local_58[0]._M_node =
         (_Base_ptr)
         std::
         map<int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::less<int>,_std::allocator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
         ::end((map<int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::less<int>,_std::allocator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                *)in_stack_ffffffffffffff78);
    bVar1 = std::operator!=(&local_40,local_58);
    if (bVar1) {
      std::
      _Rb_tree_const_iterator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                    *)0x19ea0f);
      Detail::BoundArgFunction<Catch::ConfigData>::set
                ((BoundArgFunction<Catch::ConfigData> *)this_00._M_node,in_stack_ffffffffffffff78,
                 (string *)0x19ea29);
    }
    else {
      std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
      push_back(this_01,__x);
    }
    if (local_38->type == Positional) {
      local_28 = local_28 + 1;
    }
    local_30 = (value_type *)((long)&local_30->type + 1);
  }
  return in_RDI;
}

Assistant:

std::vector<Parser::Token> populateFixedArgs( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            std::vector<Parser::Token> unusedTokens;
            int position = 1;
            for( std::size_t i = 0; i < tokens.size(); ++i ) {
                Parser::Token const& token = tokens[i];
                typename std::map<int, Arg>::const_iterator it = m_positionalArgs.find( position );
                if( it != m_positionalArgs.end() )
                    it->second.boundField.set( config, token.data );
                else
                    unusedTokens.push_back( token );
                if( token.type == Parser::Token::Positional )
                    position++;
            }
            return unusedTokens;
        }